

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::Encode
          (FundamentalOperationalData *this,KDataStream *stream)

{
  KDataStream::Write(stream,(this->field_0).field_0.m_ui8SystemStatus);
  KDataStream::Write(stream,(this->field_0).field_0.m_ui8AltParam4);
  KDataStream::Write(stream,(this->field_0).field_0.m_ui8InfoLayers);
  KDataStream::Write(stream,(this->field_0).field_0.m_ui8Modifier);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param1);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param2);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param3);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param4);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param5);
  KDataStream::Write<unsigned_short>(stream,(this->field_0).field_0.m_ui16Param6);
  return;
}

Assistant:

void FundamentalOperationalData::Encode( KDataStream & stream ) const
{
    stream << m_ui8SystemStatus
           << m_ui8AltParam4
           << m_ui8InfoLayers
           << m_ui8Modifier
           << m_ui16Param1
           << m_ui16Param2
           << m_ui16Param3
           << m_ui16Param4
           << m_ui16Param5
           << m_ui16Param6;
}